

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O1

void __thiscall
icu_63::CollationElementIterator::setOffset
          (CollationElementIterator *this,int32_t newOffset,UErrorCode *status)

{
  short sVar1;
  RuleBasedCollator *this_00;
  bool bVar2;
  UBool UVar3;
  int iVar4;
  UChar32 c;
  uint uVar5;
  char16_t *pcVar6;
  uint uVar7;
  int32_t lastSafeOffset;
  uint offset;
  ulong uVar8;
  
  if (U_ZERO_ERROR < *status) {
    return;
  }
  uVar8 = (ulong)(uint)newOffset;
  if (0 < newOffset) {
    sVar1 = (this->string_).fUnion.fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar4 = (this->string_).fUnion.fFields.fLength;
    }
    else {
      iVar4 = (int)sVar1 >> 5;
    }
    if (newOffset < iVar4) {
      do {
        sVar1 = (this->string_).fUnion.fStackFields.fLengthAndFlags;
        if (sVar1 < 0) {
          uVar5 = (this->string_).fUnion.fFields.fLength;
        }
        else {
          uVar5 = (int)sVar1 >> 5;
        }
        uVar7 = 0xffff;
        offset = (uint)uVar8;
        if (offset < uVar5) {
          pcVar6 = (char16_t *)((long)&(this->string_).fUnion + 2);
          if (((int)sVar1 & 2U) == 0) {
            pcVar6 = (this->string_).fUnion.fFields.fArray;
          }
          uVar7 = (uint)(ushort)pcVar6[(int)offset];
        }
        UVar3 = RuleBasedCollator::isUnsafe(this->rbc_,uVar7);
        if (UVar3 == '\0') {
LAB_0022356d:
          bVar2 = false;
        }
        else {
          if ((uVar7 & 0xfc00) == 0xd800) {
            this_00 = this->rbc_;
            c = UnicodeString::char32At(&this->string_,offset);
            UVar3 = RuleBasedCollator::isUnsafe(this_00,c);
            if (UVar3 == '\0') goto LAB_0022356d;
          }
          uVar8 = (ulong)(offset - 1);
          bVar2 = true;
        }
        uVar5 = (uint)uVar8;
      } while ((bVar2) && (0 < (int)uVar5));
      bVar2 = true;
      uVar7 = newOffset;
      while ((int)uVar5 < newOffset) {
        (*(this->iter_->super_UObject)._vptr_UObject[4])(this->iter_,uVar8);
        do {
          CollationIterator::nextCE(this->iter_,status);
          bVar2 = *status < U_ILLEGAL_ARGUMENT_ERROR;
          uVar7 = newOffset;
          if (U_ZERO_ERROR < *status) goto LAB_002235c3;
          uVar5 = (*(this->iter_->super_UObject)._vptr_UObject[5])();
        } while (uVar5 == (uint)uVar8);
        if ((int)uVar5 <= newOffset) {
          uVar8 = (ulong)uVar5;
        }
        uVar7 = (uint)uVar8;
      }
LAB_002235c3:
      newOffset = uVar7;
      if (!bVar2) {
        return;
      }
    }
  }
  (*(this->iter_->super_UObject)._vptr_UObject[4])(this->iter_,(ulong)(uint)newOffset);
  this->otherHalf_ = 0;
  this->dir_ = '\x01';
  return;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }